

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

BroadcastInfo * parseBroadcastInfo(BroadcastInfo *__return_storage_ptr__,string *message)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  uint uVar4;
  string __str;
  char *local_50 [2];
  char local_40 [16];
  
  (__return_storage_ptr__->ip)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->ip).field_2;
  (__return_storage_ptr__->ip)._M_string_length = 0;
  (__return_storage_ptr__->ip).field_2._M_local_buf[0] = '\0';
  pcVar2 = (message->_M_dataplus)._M_p;
  bVar1 = pcVar2[3];
  uVar4 = 1;
  if (9 < bVar1) {
    uVar4 = 3 - (bVar1 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar4,(uint)bVar1);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar3);
  bVar1 = pcVar2[4];
  uVar4 = 1;
  if (9 < bVar1) {
    uVar4 = 3 - (bVar1 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar4,(uint)bVar1);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::push_back(cVar3);
  bVar1 = pcVar2[5];
  uVar4 = 1;
  if (9 < bVar1) {
    uVar4 = 3 - (bVar1 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar4,(uint)bVar1);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::push_back(cVar3);
  bVar1 = pcVar2[6];
  uVar4 = 1;
  if (9 < bVar1) {
    uVar4 = 3 - (bVar1 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar4,(uint)bVar1);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  bVar1 = pcVar2[7];
  __return_storage_ptr__->port = (uint)bVar1 << 8;
  __return_storage_ptr__->port = (uint)CONCAT11(bVar1,pcVar2[8]);
  bVar1 = pcVar2[9];
  __return_storage_ptr__->key = (uint)bVar1 << 8;
  __return_storage_ptr__->key = (uint)CONCAT11(bVar1,pcVar2[10]);
  return __return_storage_ptr__;
}

Assistant:

BroadcastInfo parseBroadcastInfo(const std::string & message) {
    BroadcastInfo result;

    const uint8_t *p = (uint8_t *) message.data();
    p += strlen(kFileBroadcastPrefix);

    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));

    result.port  = 256*((int)(*p++));
    result.port +=     ((int)(*p++));

    result.key  = 256*((int)(*p++));
    result.key +=     ((int)(*p++));

    return result;
}